

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

void __thiscall HEkk::clearEkkAllStatus(HEkk *this)

{
  (this->status_).initialised_for_new_lp = false;
  (this->status_).initialised_for_solve = false;
  (this->status_).has_basis = false;
  (this->status_).has_ar_matrix = false;
  (this->status_).has_nla = false;
  (this->status_).has_dual_steepest_edge_weights = false;
  (this->status_).has_invert = false;
  (this->status_).has_fresh_invert = false;
  (this->status_).has_fresh_rebuild = false;
  (this->status_).has_dual_objective_value = false;
  (this->status_).has_primal_objective_value = false;
  return;
}

Assistant:

void HEkk::clearEkkAllStatus() {
  // Clears the Ekk status entirely. Functionally junks all
  // information relating to the simplex solve, but doesn't clear the
  // associated data scalars and vectors.
  HighsSimplexStatus& status = this->status_;
  status.initialised_for_new_lp = false;
  status.initialised_for_solve = false;
  this->clearNlaStatus();
  this->clearEkkDataStatus();
}